

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastV64S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  char *pcVar5;
  uint *puVar6;
  ParseContext *ctx_00;
  ulong uVar7;
  unsigned_long uVar8;
  ushort *puVar9;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  uVar8 = (unsigned_long)ptr[1];
  if ((long)uVar8 < 0) {
    uVar7 = (long)ptr[2] << 7 | 0x7f;
    if ((long)uVar7 < 0) {
      ctx_00 = (ParseContext *)((long)ptr[3] << 0xe | 0x3fff);
      if ((long)ctx_00 < 0) {
        uVar7 = uVar7 & ((long)ptr[4] << 0x15 | 0x1fffffU);
        if ((long)uVar7 < 0) {
          ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[5] << 0x1c | 0xfffffffU));
          if ((long)ctx_00 < 0) {
            uVar7 = uVar7 & ((long)ptr[6] << 0x23 | 0x7ffffffffU);
            if ((long)uVar7 < 0) {
              ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[7] << 0x2a | 0x3ffffffffffU));
              if ((long)ctx_00 < 0) {
                uVar7 = uVar7 & ((long)ptr[8] << 0x31 | 0x1ffffffffffffU);
                if ((long)uVar7 < 0) {
                  ctx_00 = (ParseContext *)
                           ((ulong)ctx_00 & ((ulong)(byte)ptr[9] << 0x38 | 0xffffffffffffff));
                  if ((long)ctx_00 < 0) {
                    bVar1 = ptr[10];
                    puVar9 = (ushort *)(ptr + 0xb);
                    if (bVar1 != 1) {
                      if ((char)bVar1 < '\0') {
                        pcVar5 = Error(msg,(char *)CONCAT71(0xffffffffffffff,bVar1),ctx_00,data,
                                       table,hasbits);
                        return pcVar5;
                      }
                      if ((bVar1 & 1) == 0) {
                        ctx_00 = (ParseContext *)((ulong)ctx_00 ^ 0x8000000000000000);
                      }
                    }
                  }
                  else {
                    puVar9 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  puVar9 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar9 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar9 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar9 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar9 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar9 = (ushort *)(ptr + 4);
      }
      uVar7 = uVar7 & (ulong)ctx_00;
    }
    else {
      puVar9 = (ushort *)(ptr + 3);
    }
    uVar8 = uVar8 & uVar7;
  }
  else {
    puVar9 = (ushort *)(ptr + 2);
  }
  uVar7 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  puVar3 = RefAt<unsigned_long>(msg,(ulong)data.field_0 >> 0x30);
  *puVar3 = uVar8;
  if (puVar9 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar2 = (uint)table->fast_idx_mask & (uint)*puVar9;
    if ((uVar2 & 7) == 0) {
      uVar4 = (ulong)(uVar2 & 0xfffffff8);
      pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                 (msg,puVar9,ctx,
                                  (ulong)*puVar9 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                  table,uVar7);
      return pcVar5;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar6 = *puVar6 | (uint)uVar7;
  }
  return (char *)puVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return FastVarintS1<uint64_t>(PROTOBUF_TC_PARAM_PASS);
}